

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ossl_associate_connection(Curl_easy *data,connectdata *conn,int sockindex)

{
  byte bVar1;
  ssl_backend_data *psVar2;
  int idx;
  int idx_00;
  int idx_01;
  int idx_02;
  bool bVar3;
  int proxy_idx;
  int sockindex_idx;
  int connectdata_idx;
  int data_idx;
  ssl_backend_data *backend;
  ssl_connect_data *connssl;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  psVar2 = conn->ssl[sockindex].backend;
  if (psVar2->handle != (SSL *)0x0) {
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      bVar1 = (data->set).proxy_ssl.primary.field_0x68;
    }
    else {
      bVar1 = (data->set).ssl.primary.field_0x68;
    }
    if ((bVar1 >> 3 & 1) != 0) {
      idx = ossl_get_ssl_data_index();
      idx_00 = ossl_get_ssl_conn_index();
      idx_01 = ossl_get_ssl_sockindex_index();
      idx_02 = ossl_get_proxy_index();
      if ((((-1 < idx) && (-1 < idx_00)) && (-1 < idx_01)) && (-1 < idx_02)) {
        SSL_set_ex_data((SSL *)psVar2->handle,idx,data);
        SSL_set_ex_data((SSL *)psVar2->handle,idx_00,conn);
        SSL_set_ex_data((SSL *)psVar2->handle,idx_01,conn->sock + sockindex);
        bVar3 = false;
        if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
          bVar3 = conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete
          ;
        }
        SSL_set_ex_data((SSL *)psVar2->handle,idx_02,(void *)(ulong)bVar3);
      }
    }
  }
  return;
}

Assistant:

static void ossl_associate_connection(struct Curl_easy *data,
                                      struct connectdata *conn,
                                      int sockindex)
{
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct ssl_backend_data *backend = connssl->backend;

  /* If we don't have SSL context, do nothing. */
  if(!backend->handle)
    return;

  if(SSL_SET_OPTION(primary.sessionid)) {
    int data_idx = ossl_get_ssl_data_index();
    int connectdata_idx = ossl_get_ssl_conn_index();
    int sockindex_idx = ossl_get_ssl_sockindex_index();
    int proxy_idx = ossl_get_proxy_index();

    if(data_idx >= 0 && connectdata_idx >= 0 && sockindex_idx >= 0 &&
       proxy_idx >= 0) {
      /* Store the data needed for the "new session" callback.
       * The sockindex is stored as a pointer to an array element. */
      SSL_set_ex_data(backend->handle, data_idx, data);
      SSL_set_ex_data(backend->handle, connectdata_idx, conn);
      SSL_set_ex_data(backend->handle, sockindex_idx, conn->sock + sockindex);
#ifndef CURL_DISABLE_PROXY
      SSL_set_ex_data(backend->handle, proxy_idx, SSL_IS_PROXY() ? (void *) 1:
                      NULL);
#else
      SSL_set_ex_data(backend->handle, proxy_idx, NULL);
#endif
    }
  }
}